

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O0

int __thiscall BCL::fetch_and_op<int>(BCL *this,GlobalPtr<int> ptr,int *val,atomic_op<int> *op)

{
  int *piVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  debug_error *pdVar7;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a5;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_54;
  undefined1 local_50 [4];
  int error_code;
  MPI_Request request;
  long *plStack_40;
  int rv;
  atomic_op<int> *op_local;
  int *val_local;
  GlobalPtr<int> ptr_local;
  
  ptr_local.rank = ptr.rank;
  plStack_40 = (long *)val;
  op_local = (atomic_op<int> *)ptr.ptr;
  val_local = (int *)this;
  uVar3 = (**(code **)(*(long *)((long)val + *(long *)(*(long *)val + -0x28)) + 8))
                    ((long)val + *(long *)(*(long *)val + -0x28));
  uVar4 = (**(code **)(*(long *)((long)plStack_40 + *(long *)(*plStack_40 + -0x28)) + 8))
                    ((long)plStack_40 + *(long *)(*plStack_40 + -0x28));
  sVar2 = ptr_local.rank;
  piVar1 = val_local;
  uVar5 = (**(code **)(*(long *)((long)plStack_40 + *(long *)(*plStack_40 + -0x28)) + 8))
                    ((long)plStack_40 + *(long *)(*plStack_40 + -0x28));
  uVar6 = (*(code *)**(undefined8 **)((long)plStack_40 + *(long *)(*plStack_40 + -0x28)))
                    ((long)plStack_40 + *(long *)(*plStack_40 + -0x28));
  local_54 = MPI_Rget_accumulate((atomic_op<int> *)ptr.ptr,1,uVar3,(long)&request + 4,1,uVar4,
                                 (int)piVar1,sVar2,1,uVar5,uVar6,win,local_50);
  if (local_54 != 0) {
    local_a5 = 1;
    pdVar7 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_98,local_54);
    std::operator+(&local_78,"BCL fetch_and_op(): MPI_Rget_accumulate return error code ",&local_98)
    ;
    debug_error::debug_error(pdVar7,&local_78);
    local_a5 = 0;
    __cxa_throw(pdVar7,&debug_error::typeinfo,debug_error::~debug_error);
  }
  local_54 = MPI_Wait(local_50,0);
  if (local_54 != 0) {
    pdVar7 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_e8,local_54);
    std::operator+(&local_c8,"BCL fetch_and_op(): MPI_Rget_accumulate (MPI_Wait) return error code "
                   ,&local_e8);
    debug_error::debug_error(pdVar7,&local_c8);
    __cxa_throw(pdVar7,&debug_error::typeinfo,debug_error::~debug_error);
  }
  return request._4_4_;
}

Assistant:

inline T fetch_and_op(const GlobalPtr <T> ptr, const T &val, const atomic_op <T> &op) {
  T rv;
  MPI_Request request;

  int error_code = MPI_Rget_accumulate(&val, 1, op.type(),
                                       &rv, 1, op.type(),
                                       ptr.rank, ptr.ptr, 1, op.type(),
                                       op.op(), BCL::win, &request);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL fetch_and_op(): MPI_Rget_accumulate return error code " + std::to_string(error_code));
          }
  )

  error_code = MPI_Wait(&request, MPI_STATUS_IGNORE);

  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL fetch_and_op(): MPI_Rget_accumulate (MPI_Wait) return error code " + std::to_string(error_code));
          }
  )
  return rv;
}